

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSEngine.cpp
# Opt level: O2

void __thiscall PSEngine::apply_rule(PSEngine *this,Rule *p_rule)

{
  _Base_ptr p_Var1;
  PSEngine *this_00;
  pointer pRVar2;
  RuleApplicationDelta *delta;
  pointer p_delta;
  AbsoluteDirection rule_app_dir;
  function<void_(int,_std::vector<PSEngine::PatternMatchInformation,_std::allocator<PSEngine::PatternMatchInformation>_>)>
  compute_pattern_match_combinations;
  vector<PSEngine::PatternMatchInformation,_std::allocator<PSEngine::PatternMatchInformation>_>
  local_168;
  RuleDelta rule_delta;
  set<PSEngine::AbsoluteDirection,_std::less<PSEngine::AbsoluteDirection>,_std::allocator<PSEngine::AbsoluteDirection>_>
  application_directions;
  optional<std::unordered_set<PSVector2i,_std::hash<PSVector2i>,_std::equal_to<PSVector2i>,_std::allocator<PSVector2i>_>_>
  application_positions;
  
  this_00 = this;
  find_cells_for_rule_application(&application_positions,this,p_rule);
  if ((application_positions.
       super__Optional_base<std::unordered_set<PSVector2i,_std::hash<PSVector2i>,_std::equal_to<PSVector2i>,_std::allocator<PSVector2i>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::unordered_set<PSVector2i,_std::hash<PSVector2i>,_std::equal_to<PSVector2i>,_std::allocator<PSVector2i>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::unordered_set<PSVector2i,_std::hash<PSVector2i>,_std::equal_to<PSVector2i>,_std::allocator<PSVector2i>_>_>
       ._M_engaged != true) ||
     (application_positions.
      super__Optional_base<std::unordered_set<PSVector2i,_std::hash<PSVector2i>,_std::equal_to<PSVector2i>,_std::allocator<PSVector2i>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::unordered_set<PSVector2i,_std::hash<PSVector2i>,_std::equal_to<PSVector2i>,_std::allocator<PSVector2i>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::unordered_set<PSVector2i,_std::hash<PSVector2i>,_std::equal_to<PSVector2i>,_std::allocator<PSVector2i>_>_>
      ._M_payload._M_value._M_h._M_element_count != 0)) {
    rule_delta.is_movement_resolution = false;
    rule_delta.movement_deltas.
    super__Vector_base<PSEngine::MovementDelta,_std::allocator<PSEngine::MovementDelta>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    rule_delta.movement_deltas.
    super__Vector_base<PSEngine::MovementDelta,_std::allocator<PSEngine::MovementDelta>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    rule_delta.movement_deltas.
    super__Vector_base<PSEngine::MovementDelta,_std::allocator<PSEngine::MovementDelta>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    rule_delta.rule_applied.rule_line = -1;
    rule_delta.rule_applied.is_late_rule = false;
    rule_delta.rule_applied.direction = None;
    rule_delta.rule_applied.match_patterns.
    super__Vector_base<CompiledGame::Pattern,_std::allocator<CompiledGame::Pattern>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    rule_delta.rule_applied.match_patterns.
    super__Vector_base<CompiledGame::Pattern,_std::allocator<CompiledGame::Pattern>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    rule_delta.rule_applied.match_patterns.
    super__Vector_base<CompiledGame::Pattern,_std::allocator<CompiledGame::Pattern>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    rule_delta.rule_applied.result_patterns.
    super__Vector_base<CompiledGame::Pattern,_std::allocator<CompiledGame::Pattern>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    rule_delta.rule_applied.result_patterns.
    super__Vector_base<CompiledGame::Pattern,_std::allocator<CompiledGame::Pattern>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    rule_delta.rule_applied.result_patterns.
    super__Vector_base<CompiledGame::Pattern,_std::allocator<CompiledGame::Pattern>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    rule_delta.rule_applied.commands.
    super__Vector_base<CompiledGame::Command,_std::allocator<CompiledGame::Command>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    rule_delta.rule_applied.commands.
    super__Vector_base<CompiledGame::Command,_std::allocator<CompiledGame::Command>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    rule_delta.rule_applied.commands.
    super__Vector_base<CompiledGame::Command,_std::allocator<CompiledGame::Command>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    rule_delta.rule_applied.deltas.
    super__Vector_base<CompiledGame::Delta,_std::allocator<CompiledGame::Delta>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    rule_delta.rule_applied.deltas.
    super__Vector_base<CompiledGame::Delta,_std::allocator<CompiledGame::Delta>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    rule_delta.rule_applied.deltas.
    super__Vector_base<CompiledGame::Delta,_std::allocator<CompiledGame::Delta>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    rule_delta.rule_application_deltas.
    super__Vector_base<PSEngine::RuleApplicationDelta,_std::allocator<PSEngine::RuleApplicationDelta>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    rule_delta.rule_application_deltas.
    super__Vector_base<PSEngine::RuleApplicationDelta,_std::allocator<PSEngine::RuleApplicationDelta>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    rule_delta.rule_application_deltas.
    super__Vector_base<PSEngine::RuleApplicationDelta,_std::allocator<PSEngine::RuleApplicationDelta>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    get_absolute_directions_from_rule_direction(&application_directions,this_00,p_rule->direction);
    for (p_Var1 = application_directions._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var1 != &application_directions._M_t._M_impl.super__Rb_tree_header;
        p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
      rule_app_dir = p_Var1[1]._M_color;
      compute_pattern_match_combinations.super__Function_base._M_manager = (_Manager_type)0x0;
      compute_pattern_match_combinations._M_invoker = (_Invoker_type)0x0;
      compute_pattern_match_combinations.super__Function_base._M_functor._M_unused._M_object =
           (void *)0x0;
      compute_pattern_match_combinations.super__Function_base._M_functor._8_8_ = 0;
      compute_pattern_match_combinations.super__Function_base._M_functor._M_unused._M_object =
           operator_new(0x30);
      *(Rule **)compute_pattern_match_combinations.super__Function_base._M_functor._M_unused._0_8_ =
           p_rule;
      *(PSEngine **)
       ((long)compute_pattern_match_combinations.super__Function_base._M_functor._M_unused._0_8_ + 8
       ) = this;
      *(AbsoluteDirection **)
       ((long)compute_pattern_match_combinations.super__Function_base._M_functor._M_unused._0_8_ +
       0x10) = &rule_app_dir;
      *(RuleDelta **)
       ((long)compute_pattern_match_combinations.super__Function_base._M_functor._M_unused._0_8_ +
       0x18) = &rule_delta;
      *(optional<std::unordered_set<PSVector2i,_std::hash<PSVector2i>,_std::equal_to<PSVector2i>,_std::allocator<PSVector2i>_>_>
        **)((long)compute_pattern_match_combinations.super__Function_base._M_functor._M_unused._0_8_
           + 0x20) = &application_positions;
      *(function<void_(int,_std::vector<PSEngine::PatternMatchInformation,_std::allocator<PSEngine::PatternMatchInformation>_>)>
        **)((long)compute_pattern_match_combinations.super__Function_base._M_functor._M_unused._0_8_
           + 0x28) = &compute_pattern_match_combinations;
      compute_pattern_match_combinations._M_invoker =
           std::
           _Function_handler<void_(int,_std::vector<PSEngine::PatternMatchInformation,_std::allocator<PSEngine::PatternMatchInformation>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/KerDelos[P]Psionic/src/PSEngine.cpp:785:103)>
           ::_M_invoke;
      compute_pattern_match_combinations.super__Function_base._M_manager =
           std::
           _Function_handler<void_(int,_std::vector<PSEngine::PatternMatchInformation,_std::allocator<PSEngine::PatternMatchInformation>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/KerDelos[P]Psionic/src/PSEngine.cpp:785:103)>
           ::_M_manager;
      local_168.
      super__Vector_base<PSEngine::PatternMatchInformation,_std::allocator<PSEngine::PatternMatchInformation>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_168.
      super__Vector_base<PSEngine::PatternMatchInformation,_std::allocator<PSEngine::PatternMatchInformation>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_168.
      super__Vector_base<PSEngine::PatternMatchInformation,_std::allocator<PSEngine::PatternMatchInformation>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      function<void_(int,_std::vector<PSEngine::PatternMatchInformation,_std::allocator<PSEngine::PatternMatchInformation>_>)>
      ::operator()(&compute_pattern_match_combinations,0,&local_168);
      std::
      vector<PSEngine::PatternMatchInformation,_std::allocator<PSEngine::PatternMatchInformation>_>
      ::~vector(&local_168);
      std::_Function_base::~_Function_base(&compute_pattern_match_combinations.super__Function_base)
      ;
    }
    pRVar2 = rule_delta.rule_application_deltas.
             super__Vector_base<PSEngine::RuleApplicationDelta,_std::allocator<PSEngine::RuleApplicationDelta>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    p_delta = rule_delta.rule_application_deltas.
              super__Vector_base<PSEngine::RuleApplicationDelta,_std::allocator<PSEngine::RuleApplicationDelta>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (rule_delta.rule_application_deltas.
        super__Vector_base<PSEngine::RuleApplicationDelta,_std::allocator<PSEngine::RuleApplicationDelta>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        rule_delta.rule_application_deltas.
        super__Vector_base<PSEngine::RuleApplicationDelta,_std::allocator<PSEngine::RuleApplicationDelta>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      CompiledGame::Rule::operator=(&rule_delta.rule_applied,p_rule);
      std::vector<PSEngine::RuleDelta,_std::allocator<PSEngine::RuleDelta>_>::push_back
                (&(this->m_turn_history).subturns.
                  super__Vector_base<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].steps,&rule_delta);
      pRVar2 = rule_delta.rule_application_deltas.
               super__Vector_base<PSEngine::RuleApplicationDelta,_std::allocator<PSEngine::RuleApplicationDelta>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      p_delta = rule_delta.rule_application_deltas.
                super__Vector_base<PSEngine::RuleApplicationDelta,_std::allocator<PSEngine::RuleApplicationDelta>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    for (; p_delta != pRVar2; p_delta = p_delta + 1) {
      apply_delta(this,p_delta);
    }
    std::
    _Rb_tree<PSEngine::AbsoluteDirection,_PSEngine::AbsoluteDirection,_std::_Identity<PSEngine::AbsoluteDirection>,_std::less<PSEngine::AbsoluteDirection>,_std::allocator<PSEngine::AbsoluteDirection>_>
    ::~_Rb_tree(&application_directions._M_t);
    RuleDelta::~RuleDelta(&rule_delta);
  }
  std::
  _Optional_payload_base<std::unordered_set<PSVector2i,_std::hash<PSVector2i>,_std::equal_to<PSVector2i>,_std::allocator<PSVector2i>_>_>
  ::_M_reset((_Optional_payload_base<std::unordered_set<PSVector2i,_std::hash<PSVector2i>,_std::equal_to<PSVector2i>,_std::allocator<PSVector2i>_>_>
              *)&application_positions);
  return;
}

Assistant:

void PSEngine::apply_rule(const CompiledGame::Rule& p_rule)
{
    optional<unordered_set<PSVector2i>> application_positions = find_cells_for_rule_application(p_rule);

    if(application_positions.has_value() && application_positions.value().size() == 0)
    {
        //there is currently no cell where this rule could be applied in the level
        return;
    }

    RuleDelta rule_delta;

    set<AbsoluteDirection> application_directions = get_absolute_directions_from_rule_direction(p_rule.direction);

    for(auto rule_app_dir : application_directions)
    {
        std::function<void(int,vector<PatternMatchInformation>)> compute_pattern_match_combinations = [&](int rule_pattern_index, vector<PatternMatchInformation> current_match_combination){
            if(rule_pattern_index >= p_rule.match_patterns.size())
            {
                RuleApplicationDelta application_delta = translate_rule_delta(p_rule, rule_app_dir, current_match_combination);

                //do not add exactly identical deltas
                //todo this could and should probably done by the compiler (altough maybe not all equalities could be caught by the compiler)
                bool add_delta = true;
                string matched_delta_app_str = "";
                for(const auto& app_delta : rule_delta.rule_application_deltas)
                {
                    if(app_delta == application_delta)
                    {
                        add_delta = false;
                        matched_delta_app_str = enum_to_str(rule_app_dir, to_absolute_direction).value_or("error");
                        for(const auto& m : current_match_combination)
                        {
                            matched_delta_app_str += " ("+to_string(m.origin.x)+","+to_string(m.origin.y)+") ";
                        }

                        break;
                    }
                }

                string new_rule_match_str = enum_to_str(rule_app_dir, to_absolute_direction).value_or("error");
                for(const auto& m : current_match_combination)
                {
                    new_rule_match_str += " ("+to_string(m.origin.x)+","+to_string(m.origin.y)+") ";
                }

                if(add_delta)
                {
                    PS_LOG("Matched the rule at "+new_rule_match_str);
                    rule_delta.rule_application_deltas.push_back(application_delta);
                }
                else
                {
                    PS_LOG("Skipping match at "+new_rule_match_str+" since it equals match at "+matched_delta_app_str);

                }
            }
            else
            {
                //todo: for now only send the application position for the first pattern, this is a bit hacky
                vector<PatternMatchInformation> matched_patterns = match_pattern(p_rule.match_patterns[rule_pattern_index], rule_app_dir, (rule_pattern_index == 0) ? application_positions : nullopt);

                for(const auto& match : matched_patterns)
                {
                    vector<PatternMatchInformation> new_match_combination = current_match_combination;
                    new_match_combination.push_back(match);

                    compute_pattern_match_combinations(rule_pattern_index+1,new_match_combination);
                }
            }

        };

        compute_pattern_match_combinations(0, vector<PatternMatchInformation>());
    }

    //todo check if there is collision between deltas

    if(rule_delta.rule_application_deltas.size() > 0)
    {
        rule_delta.rule_applied = p_rule;
        m_turn_history.subturns.back().steps.push_back(rule_delta);
    }

    for(const RuleApplicationDelta& delta : rule_delta.rule_application_deltas)
    {
        apply_delta(delta);
    }
}